

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O1

Abc_Obj_t * Abc_AigMiter(Abc_Aig_t *pMan,Vec_Ptr_t *vPairs,int fImplic)

{
  Abc_Obj_t *pAVar1;
  int nObjs;
  long lVar2;
  
  if (vPairs->nSize == 0) {
    if (pMan->pNtkAig->ntkType != ABC_NTK_STRASH) {
      __assert_fail("Abc_NtkIsStrash(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcAig.c"
                    ,0x2ad,"Abc_Obj_t *Abc_AigConst1(Abc_Ntk_t *)");
    }
    return (Abc_Obj_t *)(*(ulong *)((long)pMan->pNtkAig->pManFunc + 8) ^ 1);
  }
  if ((vPairs->nSize & 1U) != 0) {
    __assert_fail("vPairs->nSize % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcAig.c"
                  ,0x31a,"Abc_Obj_t *Abc_AigMiter(Abc_Aig_t *, Vec_Ptr_t *, int)");
  }
  if (fImplic == 0) {
    if (0 < vPairs->nSize) {
      lVar2 = 0;
      do {
        pAVar1 = Abc_AigXor(pMan,(Abc_Obj_t *)vPairs->pArray[lVar2],
                            (Abc_Obj_t *)vPairs->pArray[lVar2 + 1]);
        *(Abc_Obj_t **)((long)vPairs->pArray + lVar2 * 4) = pAVar1;
        lVar2 = lVar2 + 2;
      } while ((int)lVar2 < vPairs->nSize);
    }
  }
  else if (0 < vPairs->nSize) {
    lVar2 = 0;
    do {
      pAVar1 = Abc_AigAnd(pMan,(Abc_Obj_t *)vPairs->pArray[lVar2],
                          (Abc_Obj_t *)((ulong)vPairs->pArray[lVar2 + 1] ^ 1));
      *(Abc_Obj_t **)((long)vPairs->pArray + lVar2 * 4) = pAVar1;
      lVar2 = lVar2 + 2;
    } while ((int)lVar2 < vPairs->nSize);
  }
  nObjs = vPairs->nSize / 2;
  vPairs->nSize = nObjs;
  pAVar1 = Abc_AigMiter_rec(pMan,(Abc_Obj_t **)vPairs->pArray,nObjs);
  return pAVar1;
}

Assistant:

Abc_Obj_t * Abc_AigMiter( Abc_Aig_t * pMan, Vec_Ptr_t * vPairs, int fImplic )
{
    int i;
    if ( vPairs->nSize == 0 )
        return Abc_ObjNot( Abc_AigConst1(pMan->pNtkAig) );
    assert( vPairs->nSize % 2 == 0 );
    // go through the cubes of the node's SOP
    if ( fImplic )
    {
        for ( i = 0; i < vPairs->nSize; i += 2 )
            vPairs->pArray[i/2] = Abc_AigAnd( pMan, (Abc_Obj_t *)vPairs->pArray[i], Abc_ObjNot((Abc_Obj_t *)vPairs->pArray[i+1]) );
    }
    else
    {
        for ( i = 0; i < vPairs->nSize; i += 2 )
            vPairs->pArray[i/2] = Abc_AigXor( pMan, (Abc_Obj_t *)vPairs->pArray[i], (Abc_Obj_t *)vPairs->pArray[i+1] );
    }
    vPairs->nSize = vPairs->nSize/2;
    return Abc_AigMiter_rec( pMan, (Abc_Obj_t **)vPairs->pArray, vPairs->nSize );
}